

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O0

target_fns *
asio::execution::detail::any_executor_base::
target_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>
          (bool is_always_blocking,
          enable_if_t<_is_same<basic_executor_type<allocator<void>,_0UL>,_void>::value> *param_2)

{
  target_fns *ptVar1;
  enable_if_t<_is_same<basic_executor_type<allocator<void>,_0UL>,_void>::value> *param_3_local;
  bool is_always_blocking_local;
  
  ptVar1 = &target_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>::
            fns_with_execute;
  if (is_always_blocking) {
    ptVar1 = &target_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>::
              fns_with_blocking_execute;
  }
  return ptVar1;
}

Assistant:

static const target_fns* target_fns_table(bool is_always_blocking,
      enable_if_t<
        !is_same<Ex, void>::value
      >* = 0)
  {
    static const target_fns fns_with_execute =
    {
      &any_executor_base::target_type_ex<Ex>,
      &any_executor_base::equal_ex<Ex>,
      &any_executor_base::execute_ex<Ex>,
      0
    };

    static const target_fns fns_with_blocking_execute =
    {
      &any_executor_base::target_type_ex<Ex>,
      &any_executor_base::equal_ex<Ex>,
      0,
      &any_executor_base::blocking_execute_ex<Ex>
    };

    return is_always_blocking ? &fns_with_blocking_execute : &fns_with_execute;
  }